

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint128_c_t farmhash_cc_city_murmur(char *s,size_t len,uint128_c_t seed)

{
  uint128_c_t x;
  uint64_t uVar1;
  uint64_t uVar2;
  char *s_00;
  uint64_t hi;
  uint64_t in_RCX;
  uint64_t in_RDX;
  ulong in_RSI;
  char *in_RDI;
  uint128_c_t uVar3;
  long l;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t in_stack_ffffffffffffff88;
  uint64_t in_stack_ffffffffffffff90;
  long local_58;
  char *local_28;
  
  uVar3.b = in_RCX;
  uVar3.a = in_RDX;
  uVar1 = uint128_c_t_low64(uVar3);
  x.b = in_RCX;
  x.a = in_RDX;
  uVar2 = uint128_c_t_high64(x);
  local_58 = in_RSI - 0x10;
  if (local_58 < 1) {
    uVar1 = smix(uVar1 * -0x4b6d499041670d8d);
    s_00 = (char *)(uVar1 * -0x4b6d499041670d8d);
    in_stack_ffffffffffffff90 = farmhash_cc_len_0_to_16(s_00,uVar2);
    in_stack_ffffffffffffff90 = uVar2 * -0x4b6d499041670d8d + in_stack_ffffffffffffff90;
    if (7 < in_RSI) {
      in_stack_ffffffffffffff90 = fetch64(in_RDI);
    }
    smix((uint64_t)(s_00 + in_stack_ffffffffffffff90));
  }
  else {
    fetch64(in_RDI + (in_RSI - 8));
    farmhash_len_16(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 = uVar2 + in_RSI;
    fetch64(in_RDI + (in_RSI - 0x10));
    farmhash_len_16(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_28 = in_RDI;
    do {
      uVar1 = fetch64(local_28);
      smix(uVar1 * -0x4b6d499041670d8d);
      uVar1 = fetch64(local_28 + 8);
      smix(uVar1 * -0x4b6d499041670d8d);
      local_28 = local_28 + 0x10;
      local_58 = local_58 + -0x10;
    } while (0 < local_58);
  }
  uVar1 = farmhash_len_16(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar2 = farmhash_len_16(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  hi = farmhash_len_16(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar3 = make_uint128_c_t(uVar1 ^ uVar2,hi);
  return uVar3;
}

Assistant:

static inline uint128_c_t farmhash_cc_city_murmur(const char *s, size_t len, uint128_c_t seed) {
  uint64_t a = uint128_c_t_low64(seed);
  uint64_t b = uint128_c_t_high64(seed);
  uint64_t c = 0;
  uint64_t d = 0;
  signed long l = len - 16;
  if (l <= 0) {  // len <= 16
    a = smix(a * k1) * k1;
    c = b * k1 + farmhash_cc_len_0_to_16(s, len);
    d = smix(a + (len >= 8 ? fetch64(s) : c));
  } else {  // len > 16
    c = farmhash_len_16(fetch64(s + len - 8) + k1, a);
    d = farmhash_len_16(b + len, c + fetch64(s + len - 16));
    a += d;
    do {
      a ^= smix(fetch64(s) * k1) * k1;
      a *= k1;
      b ^= a;
      c ^= smix(fetch64(s + 8) * k1) * k1;
      c *= k1;
      d ^= c;
      s += 16;
      l -= 16;
    } while (l > 0);
  }
  a = farmhash_len_16(a, c);
  b = farmhash_len_16(d, b);
  return make_uint128_c_t(a ^ b, farmhash_len_16(b, a));
}